

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draco_encoder.cc
# Opt level: O1

int anon_unknown.dwarf_8295::EncodeMeshToFile(Mesh *mesh,string *file,ExpertEncoder *encoder)

{
  _func_int **pp_Var1;
  bool bVar2;
  int64_t iVar3;
  int iVar4;
  char *__s;
  EncoderBuffer buffer;
  Status status;
  CycleTimer timer;
  EncoderBuffer local_88;
  Status local_58;
  DracoTimer local_30;
  
  draco::EncoderBuffer::EncoderBuffer(&local_88);
  draco::DracoTimer::Start(&local_30);
  draco::ExpertEncoder::EncodeToBuffer(&local_58,(ExpertEncoder *)file,&local_88);
  if (local_58.code_ == OK) {
    draco::DracoTimer::Stop(&local_30);
    bVar2 = draco::WriteBufferToFile
                      (local_88.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       (long)local_88.buffer_.super__Vector_base<char,_std::allocator<char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_88.buffer_.super__Vector_base<char,_std::allocator<char>_>.
                             _M_impl.super__Vector_impl_data._M_start,(string *)mesh);
    if (bVar2) {
      pp_Var1 = (mesh->super_PointCloud)._vptr_PointCloud;
      iVar3 = draco::DracoTimer::GetInMs(&local_30);
      iVar4 = 0;
      printf("Encoded mesh saved to %s (%ld ms to encode).\n",pp_Var1,iVar3);
      printf("\nEncoded size = %zu bytes\n\n",
             (long)local_88.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_88.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start);
      goto LAB_001113f4;
    }
    __s = "Failed to create the output file.";
  }
  else {
    puts("Failed to encode the mesh.");
    __s = local_58.error_msg_._M_dataplus._M_p;
  }
  puts(__s);
  iVar4 = -1;
LAB_001113f4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.error_msg_._M_dataplus._M_p != &local_58.error_msg_.field_2) {
    operator_delete(local_58.error_msg_._M_dataplus._M_p,
                    local_58.error_msg_.field_2._M_allocated_capacity + 1);
  }
  if (local_88.bit_encoder_._M_t.
      super___uniq_ptr_impl<draco::EncoderBuffer::BitEncoder,_std::default_delete<draco::EncoderBuffer::BitEncoder>_>
      ._M_t.
      super__Tuple_impl<0UL,_draco::EncoderBuffer::BitEncoder_*,_std::default_delete<draco::EncoderBuffer::BitEncoder>_>
      .super__Head_base<0UL,_draco::EncoderBuffer::BitEncoder_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<draco::EncoderBuffer::BitEncoder,_std::default_delete<draco::EncoderBuffer::BitEncoder>_>
       )0x0) {
    operator_delete((void *)local_88.bit_encoder_._M_t.
                            super___uniq_ptr_impl<draco::EncoderBuffer::BitEncoder,_std::default_delete<draco::EncoderBuffer::BitEncoder>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_draco::EncoderBuffer::BitEncoder_*,_std::default_delete<draco::EncoderBuffer::BitEncoder>_>
                            .super__Head_base<0UL,_draco::EncoderBuffer::BitEncoder_*,_false>.
                            _M_head_impl,0x10);
  }
  local_88.bit_encoder_._M_t.
  super___uniq_ptr_impl<draco::EncoderBuffer::BitEncoder,_std::default_delete<draco::EncoderBuffer::BitEncoder>_>
  ._M_t.
  super__Tuple_impl<0UL,_draco::EncoderBuffer::BitEncoder_*,_std::default_delete<draco::EncoderBuffer::BitEncoder>_>
  .super__Head_base<0UL,_draco::EncoderBuffer::BitEncoder_*,_false>._M_head_impl =
       (__uniq_ptr_data<draco::EncoderBuffer::BitEncoder,_std::default_delete<draco::EncoderBuffer::BitEncoder>,_true,_true>
        )(__uniq_ptr_impl<draco::EncoderBuffer::BitEncoder,_std::default_delete<draco::EncoderBuffer::BitEncoder>_>
          )0x0;
  if (local_88.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start != (char *)0x0) {
    operator_delete(local_88.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return iVar4;
}

Assistant:

int EncodeMeshToFile(const draco::Mesh &mesh, const std::string &file,
                     draco::ExpertEncoder *encoder) {
  draco::CycleTimer timer;
  // Encode the geometry.
  draco::EncoderBuffer buffer;
  timer.Start();
  const draco::Status status = encoder->EncodeToBuffer(&buffer);
  if (!status.ok()) {
    printf("Failed to encode the mesh.\n");
    printf("%s\n", status.error_msg());
    return -1;
  }
  timer.Stop();
  // Save the encoded geometry into a file.
  if (!draco::WriteBufferToFile(buffer.data(), buffer.size(), file)) {
    printf("Failed to create the output file.\n");
    return -1;
  }
  printf("Encoded mesh saved to %s (%" PRId64 " ms to encode).\n", file.c_str(),
         timer.GetInMs());
  printf("\nEncoded size = %zu bytes\n\n", buffer.size());
  return 0;
}